

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[24],std::__cxx11::string,char[7],cm::static_string_view,char[16],std::__cxx11::string,char[7],cm::static_string_view,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [7],static_string_view *args_3,char (*args_4) [16],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [7],static_string_view *args_7,char (*args_8) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_2c8;
  size_t local_298;
  char *local_290;
  cmAlphaNum local_288;
  cmAlphaNum local_258;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  size_t local_1c8;
  char *local_1c0;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [7];
  char (*args_local_2) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [24];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [7])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [24])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_f8 = cmAlphaNum::View(a);
  local_e8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_128,(char *)args_local_1);
  local_d8 = cmAlphaNum::View(&local_128);
  cmAlphaNum::cmAlphaNum(&local_158,(string *)args_local_2);
  local_c8 = cmAlphaNum::View(&local_158);
  cmAlphaNum::cmAlphaNum(&local_188,*local_38);
  local_b8 = cmAlphaNum::View(&local_188);
  local_1c8 = (args_3->super_string_view)._M_len;
  local_1c0 = (args_3->super_string_view)._M_str;
  cmAlphaNum::cmAlphaNum(&local_1b8,args_3->super_string_view);
  local_a8 = cmAlphaNum::View(&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1f8,*args_4);
  local_98 = cmAlphaNum::View(&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_228,args_5);
  local_88 = cmAlphaNum::View(&local_228);
  cmAlphaNum::cmAlphaNum(&local_258,*args_6);
  local_78 = cmAlphaNum::View(&local_258);
  local_298 = (args_7->super_string_view)._M_len;
  local_290 = (args_7->super_string_view)._M_str;
  cmAlphaNum::cmAlphaNum(&local_288,args_7->super_string_view);
  local_68 = cmAlphaNum::View(&local_288);
  cmAlphaNum::cmAlphaNum(&local_2c8,*args_8);
  local_58 = cmAlphaNum::View(&local_2c8);
  local_48 = &local_f8;
  local_40 = 0xb;
  views._M_len = 0xb;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}